

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb__add_section(char *buffer,char *data,int curlen,int newlen)

{
  int iVar1;
  long lVar2;
  
  if (newlen < curlen) {
    iVar1 = newlen - (newlen >> 1);
    lVar2 = (long)(newlen >> 1);
    memcpy(buffer,data,lVar2 - 1);
    (buffer + lVar2 + -1)[0] = '.';
    (buffer + lVar2 + -1)[1] = '.';
    data = data + ((long)curlen - (long)iVar1) + 1;
    curlen = iVar1 + -1;
    buffer = buffer + lVar2 + 1;
  }
  memcpy(buffer,data,(long)curlen);
  return;
}

Assistant:

void stb__add_section(char *buffer, char *data, int curlen, int newlen)
{
   if (newlen < curlen) {
      int z1 = newlen >> 1, z2 = newlen-z1;
      memcpy(buffer, data, z1-1);
      buffer[z1-1] = '.';
      buffer[z1-0] = '.';
      memcpy(buffer+z1+1, data+curlen-z2+1, z2-1);
   } else
      memcpy(buffer, data, curlen);
}